

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression(xpath_parser *this,int limit)

{
  ulong uVar1;
  size_t sVar2;
  xpath_parse_result *pxVar3;
  xpath_ast_node *pxVar4;
  
  sVar2 = this->_depth;
  uVar1 = sVar2 + 1;
  this->_depth = uVar1;
  if (uVar1 < 0x401) {
    pxVar4 = parse_path_or_unary_expression(this);
    if (pxVar4 != (xpath_ast_node *)0x0) {
      pxVar4 = parse_expression_rec(this,pxVar4,limit);
      this->_depth = sVar2;
      return pxVar4;
    }
  }
  else {
    pxVar3 = this->_result;
    pxVar3->error = "Exceeded maximum allowed query depth";
    pxVar3->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  }
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_expression(int limit = 0)
		{
			size_t old_depth = _depth;

			if (++_depth > xpath_ast_depth_limit)
				return error_rec();

			xpath_ast_node* n = parse_path_or_unary_expression();
			if (!n) return NULL;

			n = parse_expression_rec(n, limit);

			_depth = old_depth;

			return n;
		}